

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init_file(char *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  ma_decoder *in_RDX;
  ma_decoder_config *in_RSI;
  char *in_RDI;
  ma_decoder_config config;
  ma_result result;
  ma_decoder *in_stack_fffffffffffffeb8;
  ma_decoder *in_stack_fffffffffffffec0;
  ma_decoder *in_stack_fffffffffffffec8;
  ma_decoder_config *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined1 local_b8 [112];
  int local_48;
  ma_result local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  ma_decoder_config_init_copy((ma_decoder_config *)in_stack_fffffffffffffec0);
  memcpy(local_b8,&stack0xfffffffffffffeb8,0x90);
  mVar1 = ma_decoder__preinit_file
                    ((char *)in_stack_fffffffffffffec8,
                     (ma_decoder_config *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (mVar1 == MA_SUCCESS) {
    local_24 = MA_NO_BACKEND;
    if (local_48 != 0) {
      if (local_48 == 1) {
        local_24 = ma_decoder_init_wav_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x246235)
        ;
      }
      if (local_48 == 2) {
        local_24 = ma_decoder_init_flac_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x246263)
        ;
      }
      if (local_48 == 3) {
        local_24 = ma_decoder_init_mp3_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x246291)
        ;
      }
      if (local_48 == 4) {
        local_24 = ma_decoder_init_vorbis_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x2462bf)
        ;
      }
    }
    if (local_24 != MA_SUCCESS) {
      local_24 = ma_decoder_init_custom_from_file__internal
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8);
      if ((local_24 != MA_SUCCESS) && (local_48 != 0)) {
        return MA_NO_BACKEND;
      }
      if ((local_24 != MA_SUCCESS) &&
         (mVar2 = ma_path_extension_equal
                            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0),
         mVar2 != 0)) {
        local_24 = ma_decoder_init_wav_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x24635e)
        ;
      }
      if ((local_24 != MA_SUCCESS) &&
         (mVar2 = ma_path_extension_equal
                            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0),
         mVar2 != 0)) {
        local_24 = ma_decoder_init_flac_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x2463a5)
        ;
      }
      if ((local_24 != MA_SUCCESS) &&
         (mVar2 = ma_path_extension_equal
                            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0),
         mVar2 != 0)) {
        local_24 = ma_decoder_init_mp3_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x2463ec)
        ;
      }
      if ((local_24 != MA_SUCCESS) &&
         (mVar2 = ma_path_extension_equal
                            ((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0),
         mVar2 != 0)) {
        local_24 = ma_decoder_init_vorbis_from_file__internal
                             ((char *)in_stack_fffffffffffffec0,
                              (ma_decoder_config *)in_stack_fffffffffffffeb8,(ma_decoder *)0x246433)
        ;
      }
      if (local_24 != MA_SUCCESS) {
        if (local_24 != MA_SUCCESS) {
          local_24 = ma_decoder_init_wav_from_file__internal
                               ((char *)in_stack_fffffffffffffec0,
                                (ma_decoder_config *)in_stack_fffffffffffffeb8,
                                (ma_decoder *)0x24646f);
        }
        if (local_24 != MA_SUCCESS) {
          local_24 = ma_decoder_init_flac_from_file__internal
                               ((char *)in_stack_fffffffffffffec0,
                                (ma_decoder_config *)in_stack_fffffffffffffeb8,
                                (ma_decoder *)0x24649d);
        }
        if (local_24 != MA_SUCCESS) {
          local_24 = ma_decoder_init_mp3_from_file__internal
                               ((char *)in_stack_fffffffffffffec0,
                                (ma_decoder_config *)in_stack_fffffffffffffeb8,
                                (ma_decoder *)0x2464cb);
        }
        if (local_24 != MA_SUCCESS) {
          local_24 = ma_decoder_init_vorbis_from_file__internal
                               ((char *)in_stack_fffffffffffffec0,
                                (ma_decoder_config *)in_stack_fffffffffffffeb8,
                                (ma_decoder *)0x2464f9);
        }
      }
    }
    if (local_24 == MA_SUCCESS) {
      local_24 = ma_decoder__postinit
                           ((ma_decoder_config *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                           );
      if (local_24 != MA_SUCCESS) {
        if (in_RDX->pBackendVTable == (ma_decoding_backend_vtable *)0x0) {
          return local_24;
        }
        if (in_RDX->pBackendVTable->onUninit ==
            (_func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *)0x0) {
          return local_24;
        }
        (*in_RDX->pBackendVTable->onUninit)
                  (in_RDX->pBackendUserData,&in_RDX->pBackend,&in_RDX->allocationCallbacks);
        return local_24;
      }
    }
    else {
      mVar1 = ma_decoder_init_vfs((ma_vfs *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI,in_RDX);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
    }
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init_file(const char* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_file(pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_file__internal(pFilePath, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* First try loading based on the file extension so we don't waste time opening and closing files. */
    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "wav")) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "flac")) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "mp3")) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "ogg")) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif

        /*
        If we still haven't got a result just use trial and error. Custom decoders have already been attempted, so here we
        need only iterate over our stock decoders.
        */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a file path. Use miniaudio's file IO instead. */
        result = ma_decoder_init_vfs(NULL, pFilePath, pConfig, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}